

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest.hpp
# Opt level: O0

void __thiscall iutest::UnitTestSource::SetUpDefaultXmlListener(UnitTestSource *this)

{
  bool bVar1;
  iu_stringstream *piVar2;
  ostream *os;
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value;
  iu_ostream *piVar3;
  TestEventListeners *this_00;
  TestEventListeners *this_01;
  TestEventListener *listener;
  IUTestLog local_1a0;
  UnitTestSource *local_10;
  UnitTestSource *this_local;
  
  local_10 = this;
  bVar1 = TestEnv::is_output_option_dirty();
  if (bVar1) {
    bVar1 = TestEnv::has_output_option();
    if (bVar1) {
      TestEnv::flush_output_option();
      do {
        bVar1 = DefaultXmlGeneratorListener::SetUp();
        if (bVar1) {
          return;
        }
        bVar1 = JunitXmlGeneratorListener::SetUp();
        if (bVar1) {
          return;
        }
        detail::IUTestLog::IUTestLog
                  (&local_1a0,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest.hpp"
                   ,0x7b0);
        piVar2 = detail::IUTestLog::GetStream_abi_cxx11_(&local_1a0);
        os = std::operator<<((ostream *)&piVar2->field_0x10,"unrecognized output format \"");
        value = TestEnv::get_output_option_abi_cxx11_();
        piVar3 = iutest::operator<<(os,value);
        std::operator<<(piVar3,"\" ignored.");
        detail::IUTestLog::~IUTestLog(&local_1a0);
        bVar1 = detail::AlwaysFalse();
      } while (bVar1);
    }
    else {
      this_00 = TestEnv::event_listeners();
      this_01 = TestEnv::event_listeners();
      listener = TestEventListeners::default_xml_generator(this_01);
      TestEventListeners::Release(this_00,listener);
    }
  }
  return;
}

Assistant:

void SetUpDefaultXmlListener()
    {
        if( TestEnv::is_output_option_dirty() )
        {
            if( TestEnv::has_output_option() )
            {
                TestEnv::flush_output_option();

                do
                {
#if defined(__WANDBOX__)
                    if( StderrXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
                    if( StderrJunitXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
#else
                    if( DefaultXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
                    if( JunitXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
#endif
                    IUTEST_LOG_(WARNING) << "unrecognized output format \"" << TestEnv::get_output_option() << "\" ignored.";
                } while( detail::AlwaysFalse() );
            }
            else
            {
                TestEnv::event_listeners().Release(TestEnv::event_listeners().default_xml_generator());
            }
        }
    }